

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathEqualValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr arg2_00;
  uint local_34;
  int ret;
  xmlXPathObjectPtr argtmp;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  xmlXPathParserContextPtr ctxt_local;
  
  local_34 = 0;
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    arg2_00 = xmlXPathValuePop(ctxt);
    arg2 = xmlXPathValuePop(ctxt);
    if ((arg2 == (xmlXPathObjectPtr)0x0) || (arg2_00 == (xmlXPathObjectPtr)0x0)) {
      if (arg2 == (xmlXPathObjectPtr)0x0) {
        xmlXPathReleaseObject(ctxt->context,arg2_00);
      }
      else {
        xmlXPathReleaseObject(ctxt->context,arg2);
      }
      xmlXPathErr(ctxt,10);
      ctxt_local._4_4_ = 0;
    }
    else if (arg2 == arg2_00) {
      xmlXPathFreeObject(arg2);
      ctxt_local._4_4_ = 1;
    }
    else if ((((arg2_00->type == XPATH_NODESET) || (arg2_00->type == XPATH_XSLT_TREE)) ||
             (arg2->type == XPATH_NODESET)) || (arg2->type == XPATH_XSLT_TREE)) {
      argtmp = arg2_00;
      if ((arg2->type != XPATH_NODESET) && (arg2->type != XPATH_XSLT_TREE)) {
        argtmp = arg2;
        arg2 = arg2_00;
      }
      switch(argtmp->type) {
      case XPATH_UNDEFINED:
        break;
      case XPATH_NODESET:
      case XPATH_XSLT_TREE:
        local_34 = xmlXPathEqualNodeSets(ctxt,arg2,argtmp,0);
        break;
      case XPATH_BOOLEAN:
        if ((arg2->nodesetval == (xmlNodeSetPtr)0x0) || (arg2->nodesetval->nodeNr == 0)) {
          local_34 = 0;
        }
        else {
          local_34 = 1;
        }
        local_34 = (uint)(local_34 == argtmp->boolval);
        break;
      case XPATH_NUMBER:
        local_34 = xmlXPathEqualNodeSetFloat(ctxt,arg2,argtmp->floatval,0);
        break;
      case XPATH_STRING:
        local_34 = xmlXPathEqualNodeSetString(ctxt,arg2,argtmp->stringval,0);
        break;
      case XPATH_USERS:
      }
      xmlXPathReleaseObject(ctxt->context,arg2);
      xmlXPathReleaseObject(ctxt->context,argtmp);
      ctxt_local._4_4_ = local_34;
    }
    else {
      ctxt_local._4_4_ = xmlXPathEqualValuesCommon(ctxt,arg2,arg2_00);
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathEqualValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg1, arg2, argtmp;
    int ret = 0;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if (arg1 == arg2) {
	xmlXPathFreeObject(arg1);
        return(1);
    }

    /*
     *If either argument is a nodeset, it's a 'special case'
     */
    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 *Hack it to assure arg1 is the nodeset
	 */
	if ((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE)) {
		argtmp = arg2;
		arg2 = arg1;
		arg1 = argtmp;
	}
	switch (arg2->type) {
	    case XPATH_UNDEFINED:
		break;
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		ret = xmlXPathEqualNodeSets(ctxt, arg1, arg2, 0);
		break;
	    case XPATH_BOOLEAN:
		if ((arg1->nodesetval == NULL) ||
		  (arg1->nodesetval->nodeNr == 0)) ret = 0;
		else
		    ret = 1;
		ret = (ret == arg2->boolval);
		break;
	    case XPATH_NUMBER:
		ret = xmlXPathEqualNodeSetFloat(ctxt, arg1, arg2->floatval, 0);
		break;
	    case XPATH_STRING:
		ret = xmlXPathEqualNodeSetString(ctxt, arg1,
                                                 arg2->stringval, 0);
		break;
	    case XPATH_USERS:
		/* TODO */
		break;
	}
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	return(ret);
    }

    return (xmlXPathEqualValuesCommon(ctxt, arg1, arg2));
}